

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.c
# Opt level: O2

void close_sockets(pmtr_t *cfg)

{
  uint uVar1;
  int *piVar2;
  ulong uVar3;
  UT_array *pUVar4;
  int *piVar5;
  UT_array *pUVar6;
  size_t _ut_i;
  ulong uVar7;
  ulong uVar8;
  
  piVar5 = (int *)0x0;
  do {
    pUVar6 = cfg->listen;
    uVar7 = (ulong)pUVar6->i;
    if (piVar5 == (int *)0x0) {
      if (uVar7 == 0) break;
      piVar5 = (int *)pUVar6->d;
    }
    else {
      piVar2 = (int *)pUVar6->d;
      if (piVar5 < piVar2) {
        if (uVar7 == 0) break;
        uVar8 = (pUVar6->icd).sz;
        uVar3 = 0;
      }
      else {
        uVar8 = (pUVar6->icd).sz;
        uVar3 = (ulong)((long)piVar5 - (long)piVar2) / uVar8 + 1;
        if (uVar7 <= uVar3) break;
      }
      piVar5 = (int *)((long)piVar2 + uVar8 * uVar3);
    }
    if (piVar5 == (int *)0x0) break;
    close(*piVar5);
  } while( true );
  piVar5 = (int *)0x0;
  do {
    pUVar6 = cfg->report;
    uVar1 = pUVar6->i;
    uVar7 = (ulong)uVar1;
    if (piVar5 == (int *)0x0) {
      if (uVar1 == 0) {
LAB_00106be2:
        uVar7 = 0;
LAB_00106be4:
        pUVar4 = cfg->listen;
        uVar1 = pUVar4->i;
        if (uVar1 != 0) {
          if ((pUVar4->icd).dtor != (undefined1 *)0x0) {
            for (uVar7 = 0; uVar7 < uVar1; uVar7 = uVar7 + 1) {
              (*(code *)(pUVar4->icd).dtor)(pUVar4->d + (pUVar4->icd).sz * uVar7);
              pUVar4 = cfg->listen;
              uVar1 = pUVar4->i;
            }
            pUVar6 = cfg->report;
          }
          pUVar4->i = 0;
          uVar7 = (ulong)pUVar6->i;
        }
        if ((int)uVar7 != 0) {
          if ((pUVar6->icd).dtor != (undefined1 *)0x0) {
            for (uVar8 = 0; uVar8 < uVar7; uVar8 = uVar8 + 1) {
              (*(code *)(pUVar6->icd).dtor)(pUVar6->d + (pUVar6->icd).sz * uVar8);
              pUVar6 = cfg->report;
              uVar7 = (ulong)pUVar6->i;
            }
          }
          pUVar6->i = 0;
        }
        return;
      }
      piVar5 = (int *)pUVar6->d;
    }
    else {
      piVar2 = (int *)pUVar6->d;
      if (piVar5 < piVar2) {
        if (uVar1 == 0) goto LAB_00106be2;
        uVar8 = (pUVar6->icd).sz;
        uVar3 = 0;
      }
      else {
        uVar8 = (pUVar6->icd).sz;
        uVar3 = (ulong)((long)piVar5 - (long)piVar2) / uVar8 + 1;
        if (uVar7 <= uVar3) goto LAB_00106be4;
      }
      piVar5 = (int *)((long)piVar2 + uVar8 * uVar3);
    }
    if (piVar5 == (int *)0x0) goto LAB_00106be4;
    close(*piVar5);
  } while( true );
}

Assistant:

void close_sockets(pmtr_t *cfg) {
  int *fd;
  fd=NULL; while( (fd=(int*)utarray_next(cfg->listen,fd))) close(*fd);
  fd=NULL; while( (fd=(int*)utarray_next(cfg->report,fd))) close(*fd);
  utarray_clear(cfg->listen);
  utarray_clear(cfg->report);
}